

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_iCCP(ucvector *out,LodePNGInfo *info,LodePNGCompressSettings *zlibsettings)

{
  size_t size_00;
  size_t size;
  size_t keysize;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  LodePNGCompressSettings *pLStack_28;
  uint error;
  LodePNGCompressSettings *zlibsettings_local;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  chunk._4_4_ = 0;
  compressed = (uchar *)0x0;
  compressedsize = 0;
  keysize = 0;
  pLStack_28 = zlibsettings;
  zlibsettings_local = (LodePNGCompressSettings *)info;
  info_local = (LodePNGInfo *)out;
  size_00 = lodepng_strlen(info->iccp_name);
  if ((size_00 == 0) || (0x4f < size_00)) {
    out_local._4_4_ = 0x59;
  }
  else {
    chunk._4_4_ = zlib_compress((uchar **)&compressedsize,&keysize,
                                *(uchar **)&zlibsettings_local[5].windowsize,
                                (ulong)zlibsettings_local[5].nicematch,pLStack_28);
    if (chunk._4_4_ == 0) {
      chunk._4_4_ = lodepng_chunk_init(&compressed,(ucvector *)info_local,
                                       (int)size_00 + 2 + (int)keysize,"iCCP");
    }
    if (chunk._4_4_ == 0) {
      lodepng_memcpy(compressed + 8,*(void **)(zlibsettings_local + 5),size_00);
      compressed[size_00 + 8] = '\0';
      compressed[size_00 + 9] = '\0';
      lodepng_memcpy(compressed + size_00 + 10,(void *)compressedsize,keysize);
      lodepng_chunk_generate_crc(compressed);
    }
    lodepng_free((void *)compressedsize);
    out_local._4_4_ = chunk._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_iCCP(ucvector* out, const LodePNGInfo* info, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t keysize = lodepng_strlen(info->iccp_name);

  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  error = zlib_compress(&compressed, &compressedsize,
                        info->iccp_profile, info->iccp_profile_size, zlibsettings);
  if(!error) {
    size_t size = keysize + 2 + compressedsize;
    error = lodepng_chunk_init(&chunk, out, size, "iCCP");
  }
  if(!error) {
    lodepng_memcpy(chunk + 8, info->iccp_name, keysize);
    chunk[8 + keysize] = 0; /*null termination char*/
    chunk[9 + keysize] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + 10 + keysize, compressed, compressedsize);
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}